

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O2

Cnf_Dat_t * Cnf_DataReadFromFile(char *pFileName)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  char *__s;
  char *pcVar4;
  undefined4 extraout_var;
  Vec_Int_t *p;
  Cnf_Dat_t *pCVar5;
  int **ppiVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  char *local_58;
  undefined8 local_50;
  ulong local_48;
  FILE *local_40;
  char *local_38;
  
  local_40 = fopen(pFileName,"rb");
  if (local_40 == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return (Cnf_Dat_t *)0x0;
  }
  __s = (char *)malloc(1000000);
  local_38 = __s + 1;
  p = (Vec_Int_t *)0x0;
  uVar7 = 0xffffffffffffffff;
  local_70 = (Vec_Int_t *)0x0;
  local_50 = 0xffffffff;
  uVar10 = 0;
  local_58 = __s;
  do {
    local_48 = uVar7;
LAB_00472560:
    do {
      pcVar4 = fgets(__s,1000000,local_40);
      local_68 = p;
      if (pcVar4 == (char *)0x0) {
        local_60 = local_70;
        if (local_70->nSize != (int)local_50) {
          printf("Warning! The number of clauses (%d) is different from declaration (%d).\n");
        }
        Vec_IntPush(local_70,p->nSize);
        pCVar5 = (Cnf_Dat_t *)calloc(1,0x48);
        pCVar5->nVars = (int)local_48;
        uVar10 = local_70->nSize;
        pCVar5->nClauses = uVar10 - 1;
        pCVar5->nLiterals = p->nSize;
        ppiVar6 = (int **)malloc((long)(int)uVar10 << 3);
        pCVar5->pClauses = ppiVar6;
        piVar1 = p->pArray;
        p->nCap = 0;
        p->nSize = 0;
        p->pArray = (int *)0x0;
        *ppiVar6 = piVar1;
        uVar7 = 0;
        uVar8 = 0;
        if (0 < (int)uVar10) {
          uVar8 = (ulong)uVar10;
        }
        for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          ppiVar6[uVar7] = *ppiVar6 + local_70->pArray[uVar7];
        }
        goto LAB_004726cb;
      }
      uVar10 = uVar10 + 1;
    } while (*__s == 'c');
    if (*__s != 'p') {
      pcVar4 = strtok(__s," \t\r\n");
      if (pcVar4 != (char *)0x0) {
        Vec_IntPush(local_70,p->nSize);
        bVar9 = true;
        while (__s = local_58, pcVar4 != (char *)0x0) {
          uVar2 = atoi(pcVar4);
          __s = local_58;
          if (uVar2 == 0) goto LAB_00472560;
          if ((int)uVar2 < 1) {
            uVar2 = ~uVar2 * 2 + 1;
          }
          else {
            uVar2 = uVar2 * 2 - 2;
          }
          if (SBORROW4(uVar2,(int)uVar7 * 2) == (int)(uVar2 + (int)uVar7 * -2) < 0) {
            local_60 = local_70;
            pCVar5 = (Cnf_Dat_t *)0x0;
            printf("Literal %d is out-of-bound for %d variables.\n",(ulong)uVar2,local_48);
            __s = local_58;
            goto LAB_004726cb;
          }
          Vec_IntPush(p,uVar2);
          bVar9 = false;
          pcVar4 = strtok((char *)0x0," \t\r\n");
        }
        if (!bVar9) {
          local_60 = local_70;
          pCVar5 = (Cnf_Dat_t *)0x0;
          printf("There is no zero-terminator in line %d.\n",(ulong)uVar10);
          goto LAB_004726cb;
        }
      }
      goto LAB_00472560;
    }
    pcVar4 = strtok(local_38," \t");
    iVar3 = strcmp(pcVar4,"cnf");
    if (iVar3 != 0) {
      pcVar4 = "Incorrect input file.";
      goto LAB_00472823;
    }
    pcVar4 = strtok((char *)0x0," \t");
    uVar2 = atoi(pcVar4);
    uVar7 = (ulong)uVar2;
    pcVar4 = strtok((char *)0x0," \t");
    iVar3 = atoi(pcVar4);
    if (((int)uVar2 < 1) || (iVar3 < 1)) {
      pcVar4 = "Incorrect parameters.";
LAB_00472823:
      local_60 = local_70;
      puts(pcVar4);
      pCVar5 = (Cnf_Dat_t *)0x0;
LAB_004726cb:
      fclose(local_40);
      Vec_IntFreeP(&local_60);
      Vec_IntFreeP(&local_68);
      free(__s);
      return pCVar5;
    }
    local_70 = Vec_IntAlloc(iVar3 + 1);
    local_50 = CONCAT44(extraout_var,iVar3);
    p = Vec_IntAlloc(iVar3 << 3);
  } while( true );
}

Assistant:

Cnf_Dat_t * Cnf_DataReadFromFile( char * pFileName )
{
    int MaxLine = 1000000;
    int Var, Lit, nVars = -1, nClas = -1, i, Entry, iLine = 0;
    Cnf_Dat_t * pCnf = NULL;
    Vec_Int_t * vClas = NULL;
    Vec_Int_t * vLits = NULL;
    char * pBuffer, * pToken;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return NULL;
    }
    pBuffer = ABC_ALLOC( char, MaxLine );
    while ( fgets(pBuffer, MaxLine, pFile) != NULL )
    {
        iLine++;
        if ( pBuffer[0] == 'c' )
            continue;
        if ( pBuffer[0] == 'p' )
        {
            pToken = strtok( pBuffer+1, " \t" );
            if ( strcmp(pToken, "cnf") )
            {
                printf( "Incorrect input file.\n" );
                goto finish;
            }
            pToken = strtok( NULL, " \t" );
            nVars = atoi( pToken );
            pToken = strtok( NULL, " \t" );
            nClas = atoi( pToken );
            if ( nVars <= 0 || nClas <= 0 )
            {
                printf( "Incorrect parameters.\n" );
                goto finish;
            }
            // temp storage
            vClas = Vec_IntAlloc( nClas+1 );
            vLits = Vec_IntAlloc( nClas*8 );
            continue;
        }
        pToken = strtok( pBuffer, " \t\r\n" );
        if ( pToken == NULL )
            continue;
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        while ( pToken )
        {
            Var = atoi( pToken );
            if ( Var == 0 )
                break;
            Lit = (Var > 0) ? Abc_Var2Lit(Var-1, 0) : Abc_Var2Lit(-Var-1, 1);
            if ( Lit >= 2*nVars )
            {
                printf( "Literal %d is out-of-bound for %d variables.\n", Lit, nVars );
                goto finish;
            }
            Vec_IntPush( vLits, Lit );
            pToken = strtok( NULL, " \t\r\n" );
        }
        if ( Var != 0 )
        {
            printf( "There is no zero-terminator in line %d.\n", iLine );
            goto finish;
        }
    }
    // finalize
    if ( Vec_IntSize(vClas) != nClas )
        printf( "Warning! The number of clauses (%d) is different from declaration (%d).\n", Vec_IntSize(vClas), nClas );
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    // create
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->nVars     = nVars;
    pCnf->nClauses  = Vec_IntSize(vClas)-1;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->pClauses  = ABC_ALLOC( int *, Vec_IntSize(vClas) );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
finish:
    fclose( pFile );
    Vec_IntFreeP( &vClas );
    Vec_IntFreeP( &vLits );
    ABC_FREE( pBuffer );
    return pCnf;
}